

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_block.h
# Opt level: O2

StringBlock * google::protobuf::internal::StringBlock::Emplace(void *p,size_t n,StringBlock *next)

{
  ushort uVar1;
  Nullable<const_char_*> failure_msg;
  ushort uVar2;
  ushort uVar3;
  ushort local_2a;
  LogMessageFatal local_28;
  
  uVar3 = (ushort)n;
  if (next == (StringBlock *)0x0) {
    local_28.super_LogMessage._0_8_ = 0x100;
  }
  else {
    local_28.super_LogMessage._0_8_ = ZEXT28(next->next_size_);
  }
  local_2a = uVar3;
  failure_msg = absl::lts_20250127::log_internal::Check_EQImpl<unsigned_short,unsigned_long>
                          (&local_2a,(unsigned_long *)&local_28,"count == NextSize(next)");
  if (failure_msg == (Nullable<const_char_*>)0x0) {
    uVar2 = 0x2000;
    if ((ushort)(uVar3 * 2) < 0x2000) {
      uVar2 = uVar3 * 2;
    }
    uVar1 = 0x100;
    if (next != (StringBlock *)0x0) {
      uVar1 = uVar2;
    }
    *(StringBlock **)p = next;
    *(ushort *)((long)p + 8) = uVar3 - (uVar3 & 0x1f ^ 0x10);
    *(ushort *)((long)p + 10) = uVar1;
    *(undefined1 *)((long)p + 0xc) = 0;
    return (StringBlock *)p;
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            (&local_28,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/string_block.h"
             ,0x7d,failure_msg);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&local_28);
}

Assistant:

inline StringBlock* StringBlock::Emplace(void* p, size_t n, StringBlock* next) {
  const auto count = static_cast<size_type>(n);
  ABSL_DCHECK_EQ(count, NextSize(next));
  size_type doubled = count * 2;
  size_type next_size = next ? std::min(doubled, max_size()) : min_size();
  return new (p) StringBlock(next, false, RoundedSize(count), next_size);
}